

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExprWriter.cpp
# Opt level: O2

void __thiscall ExprWriter::visit(ExprWriter *this,StackAlloc *expr)

{
  ostream *poVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string local_40 [32];
  
  poVar1 = this->ss;
  iVar2 = (*(expr->super_ExprBase).super_Expr._vptr_Expr[4])(expr);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x18))
            (local_40,(long *)CONCAT44(extraout_var,iVar2));
  std::operator<<(poVar1,local_40);
  std::__cxx11::string::~string(local_40);
  std::operator<<(this->ss," ");
  poVar1 = this->ss;
  iVar2 = (*(expr->super_ExprBase).super_Expr._vptr_Expr[4])(expr);
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x20))
            (local_40,(long *)CONCAT44(extraout_var_00,iVar2),&expr->value->valueName);
  std::operator<<(poVar1,local_40);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void ExprWriter::visit(StackAlloc& expr) {
    ss << expr.getType()->toString();
    ss << " ";
    ss << expr.getType()->surroundName(expr.value->valueName);
}